

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

STBase * __thiscall jbcoin::STObject::makeFieldPresent(STObject *this,SField *field)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  SField *pSVar4;
  reference this_00;
  STVar local_98;
  STObject *local_30;
  STBase *f;
  SField *pSStack_20;
  int index;
  SField *field_local;
  STObject *this_local;
  
  pSStack_20 = field;
  field_local = (SField *)this;
  f._4_4_ = getFieldIndex(this,field);
  if (f._4_4_ == -1) {
    bVar1 = isFree(this);
    if (!bVar1) {
      Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
    }
    sVar3 = emplace_back<jbcoin::detail::nonPresentObject_t&,jbcoin::SField_const&>
                      (this,(nonPresentObject_t *)&jbcoin::detail::nonPresentObject,pSStack_20);
    this_local = (STObject *)getPIndex(this,(int)sVar3);
  }
  else {
    local_30 = (STObject *)getPIndex(this,f._4_4_);
    iVar2 = (*(local_30->super_STBase)._vptr_STBase[4])();
    if (iVar2 == 0) {
      pSVar4 = STBase::getFName(&local_30->super_STBase);
      jbcoin::detail::STVar::STVar(&local_98,pSVar4);
      this_00 = std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::
                operator[](&this->v_,(long)f._4_4_);
      jbcoin::detail::STVar::operator=(this_00,&local_98);
      jbcoin::detail::STVar::~STVar(&local_98);
      this_local = (STObject *)getPIndex(this,f._4_4_);
    }
    else {
      this_local = local_30;
    }
  }
  return &this_local->super_STBase;
}

Assistant:

STBase* STObject::makeFieldPresent (SField const& field)
{
    int index = getFieldIndex (field);

    if (index == -1)
    {
        if (!isFree ())
            Throw<std::runtime_error> ("Field not found");

        return getPIndex (emplace_back(detail::nonPresentObject, field));
    }

    STBase* f = getPIndex (index);

    if (f->getSType () != STI_NOTPRESENT)
        return f;

    v_[index] = detail::STVar(
        detail::defaultObject, f->getFName());
    return getPIndex (index);
}